

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O2

R_conflict4 QBitArray::bitLocation<QBitArray>(QBitArray *ba,qsizetype i)

{
  char *pcVar1;
  undefined8 extraout_RDX;
  R_conflict4 RVar2;
  
  pcVar1 = QByteArray::data(&ba->d);
  RVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  RVar2.bitMask = '\x01' << ((byte)i & 7);
  RVar2.byte = pcVar1 + (i >> 3) + 1;
  return RVar2;
}

Assistant:

static auto bitLocation(BitArray &ba, qsizetype i)
    {
        Q_ASSERT(size_t(i) < size_t(ba.size()));
        struct R {
            decltype(ba.d[1]) byte;
            uchar bitMask;
        };
        qsizetype byteIdx = i >> 3;
        qsizetype bitIdx = i & 7;
        return R{ ba.d[1 + byteIdx], uchar(1U << bitIdx) };
    }